

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnElemSegmentElemType(SharedValidator *this,Location *loc,Type elem_type)

{
  Result rhs;
  reference pvVar1;
  value_type *elem;
  Location *loc_local;
  SharedValidator *this_local;
  Type elem_type_local;
  Result result;
  
  Result::Result((Result *)&elem_type_local,Ok);
  pvVar1 = std::
           vector<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
           ::back(&this->elems_);
  if ((pvVar1->is_active & 1U) != 0) {
    rhs = CheckType(this,loc,elem_type,pvVar1->table_type,"elem segment");
    Result::operator|=((Result *)&elem_type_local,rhs);
  }
  pvVar1->element = elem_type;
  return (Result)elem_type_local.enum_;
}

Assistant:

Result SharedValidator::OnElemSegmentElemType(const Location& loc,
                                              Type elem_type) {
  Result result = Result::Ok;
  auto& elem = elems_.back();
  if (elem.is_active) {
    // Check that the type of the elem segment matches the table in which
    // it is active.
    result |= CheckType(loc, elem_type, elem.table_type, "elem segment");
  }
  elem.element = elem_type;
  return result;
}